

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::addSubwords
          (Dictionary *this,vector<int,_std::allocator<int>_> *line,string *token,int32_t wid)

{
  bool bVar1;
  element_type *peVar2;
  int in_ECX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Dictionary *unaff_retaddr;
  vector<int,_std::allocator<int>_> *ngrams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  Dictionary *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  string local_40 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *word;
  
  if (in_ECX < 0) {
    word = in_RDI;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (bVar1) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffa0;
      std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      std::operator+(in_RDI,__rhs);
      computeSubwords(unaff_retaddr,word,in_RSI,in_RDX);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    }
  }
  else {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14995d);
    if (peVar2->maxn < 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff60,(value_type_conflict *)in_RDI);
    }
    else {
      getSubwords(in_stack_ffffffffffffff50,(int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      std::vector<int,_std::allocator<int>_>::end(in_RSI);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_ffffffffffffff50,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RSI);
      std::vector<int,_std::allocator<int>_>::cbegin(in_RSI);
      std::vector<int,_std::allocator<int>_>::cend(in_RSI);
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void Dictionary::addSubwords(std::vector<int32_t>& line,
                             const std::string& token,
                             int32_t wid) const {
  if (wid < 0) { // out of vocab
    if (token != EOS) {
      computeSubwords(BOW + token + EOW, line);
    }
  } else {
    if (args_->maxn <= 0) { // in vocab w/o subwords
      line.push_back(wid);
    } else { // in vocab w/ subwords
      const std::vector<int32_t>& ngrams = getSubwords(wid);
      line.insert(line.end(), ngrams.cbegin(), ngrams.cend());
    }
  }
}